

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr __thiscall c4::yml::Parser::_scan_to_next_nonempty_line(Parser *this,size_t indentation)

{
  bool bVar1;
  basic_substring<const_char> bVar2;
  csubstr cVar3;
  ro_substr chars;
  csubstr local_58;
  csubstr next_peeked_triml;
  
  local_58 = (csubstr)ZEXT816(0);
  do {
    local_58 = _peek_next_line(this,(this->m_state->pos).super_LineCol.offset);
    next_peeked_triml = basic_substring<const_char>::triml(&local_58,' ');
    if ((next_peeked_triml.len != 0) && (*next_peeked_triml.str == '#')) break;
    bVar1 = basic_substring<const_char>::begins_with(&local_58,' ',indentation);
    if (bVar1) {
      _advance_to_peeked(this);
      goto LAB_001d25d7;
    }
    chars.len = 3;
    chars.str = "\t\r\n";
    bVar2 = basic_substring<const_char>::trimr(&next_peeked_triml,chars);
    if (bVar2.str != (char *)0x0 && bVar2.len != 0) break;
    bVar1 = _advance_to_peeked(this);
  } while (bVar1);
  local_58.str = (char *)0x0;
  local_58.len = 0;
LAB_001d25d7:
  cVar3.len = local_58.len;
  cVar3.str = local_58.str;
  return cVar3;
}

Assistant:

csubstr Parser::_scan_to_next_nonempty_line(size_t indentation)
{
    csubstr next_peeked;
    while(true)
    {
        _c4dbgpf("rscalar: ... curr offset: {} indentation={}", m_state->pos.offset, indentation);
        next_peeked = _peek_next_line(m_state->pos.offset);
        csubstr next_peeked_triml = next_peeked.triml(' ');
        _c4dbgpf("rscalar: ... next peeked line='{}'", next_peeked.trimr("\r\n"));
        if(next_peeked_triml.begins_with('#'))
        {
            _c4dbgp("rscalar: ... first non-space character is #");
            return {};
        }
        else if(next_peeked.begins_with(' ', indentation))
        {
            _c4dbgpf("rscalar: ... begins at same indentation {}, assuming continuation", indentation);
            _advance_to_peeked();
            return next_peeked;
        }
        else   // check for de-indentation
        {
            csubstr trimmed = next_peeked_triml.trimr("\t\r\n");
            _c4dbgpf("rscalar: ... deindented! trimmed='{}'", trimmed);
            if(!trimmed.empty())
            {
                _c4dbgp("rscalar: ... and not empty. bailing out.");
                return {};
            }
        }
        if(!_advance_to_peeked())
        {
            _c4dbgp("rscalar: file finished");
            return {};
        }
    }
    return {};
}